

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file.hpp
# Opt level: O1

string * __thiscall
czh::file::NonStreamFile::get_spec_line_abi_cxx11_
          (string *__return_storage_ptr__,NonStreamFile *this,size_t beg,size_t end,
          size_t linenosize)

{
  char cVar1;
  unsigned_long *a;
  unsigned_long *extraout_RDX;
  unsigned_long *extraout_RDX_00;
  unsigned_long *extraout_RDX_01;
  unsigned_long *extraout_RDX_02;
  ulong uVar2;
  bool bVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  size_t lineno;
  string addition;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  uint local_6c;
  ulong local_68;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_60;
  string local_58;
  size_t local_38;
  
  local_68 = 1;
  local_60 = &__return_storage_ptr__->field_2;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)local_60;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  a = (unsigned_long *)CONCAT71((int7)(beg >> 8),1 < end);
  local_38 = linenosize;
  if ((this->code)._M_string_length != 0 && 1 < end) {
    local_6c = (uint)CONCAT71((int7)(end >> 8),1);
    uVar2 = 1;
    bVar3 = true;
    do {
      if ((this->code)._M_dataplus._M_p[uVar2 - 1] == '\n') {
        local_68 = local_68 + 1;
        bVar3 = true;
      }
      else if (beg <= local_68) {
        if (bVar3) {
          utils::to_str<unsigned_long&>(&local_58,(utils *)&local_68,a);
          if (local_58._M_string_length <= local_38 && local_38 - local_58._M_string_length != 0) {
            local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
            std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            _M_construct(&local_90,local_38 - local_58._M_string_length,'0');
            std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            _M_append(__return_storage_ptr__,local_90._M_dataplus._M_p,local_90._M_string_length);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_90._M_dataplus._M_p != &local_90.field_2) {
              operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
            }
          }
          if ((local_6c & 1) == 0) {
            std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            push_back(__return_storage_ptr__,'\n');
          }
          else {
            local_6c = 0;
          }
          local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_90,local_58._M_dataplus._M_p,
                     local_58._M_dataplus._M_p + local_58._M_string_length);
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                    (&local_90,"| ");
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
                    (__return_storage_ptr__,local_90._M_dataplus._M_p,local_90._M_string_length);
          a = extraout_RDX;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_90._M_dataplus._M_p != &local_90.field_2) {
            operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
            a = extraout_RDX_00;
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_58._M_dataplus._M_p != &local_58.field_2) {
            operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
            a = extraout_RDX_01;
          }
          bVar3 = false;
        }
        cVar1 = (this->code)._M_dataplus._M_p[uVar2 - 1];
        if (cVar1 != '\r') {
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
                    (__return_storage_ptr__,cVar1);
          a = extraout_RDX_02;
        }
      }
    } while ((uVar2 < (this->code)._M_string_length) && (uVar2 = uVar2 + 1, local_68 < end));
  }
  while ((cVar1 = (__return_storage_ptr__->_M_dataplus)._M_p
                  [__return_storage_ptr__->_M_string_length - 1], cVar1 == '\r' || (cVar1 == '\n')))
  {
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::pop_back
              (__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

[[nodiscard]] std::string get_spec_line(std::size_t beg, std::size_t end, std::size_t linenosize) const override
    {
      std::size_t lineno = 1;
      bool first_line_flag = true;
      bool first_line_no = true;
      std::string ret;
      for (std::size_t i = 0; i < code.size() && lineno < end; ++i)
      {
        if (code[i] == '\n')
        {
          ++lineno;
          first_line_flag = true;
          continue;
        }
        if (lineno >= beg)
        {
          if (first_line_flag)
          {
            std::string addition = utils::to_str(lineno);
            if (addition.size() < linenosize)
              ret += std::string(linenosize - addition.size(), '0');
            if (!first_line_no)
              ret += '\n';
            else
              first_line_no = false;
            ret += addition + "| ";
            first_line_flag = false;
          }
          if (code[i] != '\r')
            ret += code[i];
        }
      }
      while (ret.back() == '\r' || ret.back() == '\n')
      {
        ret.pop_back();
      }
      return ret;
    }